

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e0a3::BuildEngineTest_duplicateRule_Test::TestBody
          (BuildEngineTest_duplicateRule_Test *this)

{
  bool bVar1;
  SimpleRule *pSVar2;
  char *pcVar3;
  reference pvVar4;
  long lVar5;
  StatusFnType *update;
  string local_240;
  AssertHelper local_220;
  Message local_218;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_;
  Message local_1f0;
  size_type local_1e8;
  uint local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar;
  function<void_(llbuild::core::Rule::StatusKind)> local_1c0;
  function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)> local_1a0;
  anon_class_1_0_00000001 local_179;
  ComputeFnType local_178;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> local_158;
  KeyType local_140;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_120;
  CommandSignature local_118;
  function<void_(llbuild::core::Rule::StatusKind)> local_110;
  function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)> local_f0;
  anon_class_1_0_00000001 local_c9;
  ComputeFnType local_c8;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> local_a8;
  KeyType local_90;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_70;
  BuildEngine local_68;
  BuildEngine engine;
  SimpleBuildEngineDelegate delegate;
  BuildEngineTest_duplicateRule_Test *this_local;
  
  delegate._72_8_ = this;
  SimpleBuildEngineDelegate::SimpleBuildEngineDelegate((SimpleBuildEngineDelegate *)&engine);
  delegate.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  llbuild::core::BuildEngine::BuildEngine(&local_68,(BuildEngineDelegate *)&engine);
  pSVar2 = (SimpleRule *)operator_new(0xa8);
  llbuild::core::KeyType::KeyType(&local_90,"value-A");
  memset(&local_a8,0,0x18);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::vector(&local_a8);
  std::function<int(std::vector<int,std::allocator<int>>const&)>::
  function<(anonymous_namespace)::BuildEngineTest_duplicateRule_Test::TestBody()::__0,void>
            ((function<int(std::vector<int,std::allocator<int>>const&)> *)&local_c8,&local_c9);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::function
            (&local_f0,(nullptr_t)0x0);
  std::function<void_(llbuild::core::Rule::StatusKind)>::function(&local_110,(nullptr_t)0x0);
  memset(&local_118,0,8);
  llbuild::basic::CommandSignature::CommandSignature(&local_118);
  SimpleRule::SimpleRule(pSVar2,&local_90,&local_a8,&local_c8,&local_f0,&local_110,&local_118);
  std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
  unique_ptr<std::default_delete<llbuild::core::Rule>,void>
            ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)&local_70,
             (pointer)pSVar2);
  llbuild::core::BuildEngine::addRule(&local_68,&local_70);
  std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::~unique_ptr
            (&local_70);
  std::function<void_(llbuild::core::Rule::StatusKind)>::~function(&local_110);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::
  ~function(&local_f0);
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::~function(&local_c8);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector(&local_a8);
  llbuild::core::KeyType::~KeyType(&local_90);
  pSVar2 = (SimpleRule *)operator_new(0xa8);
  llbuild::core::KeyType::KeyType(&local_140,"value-A");
  memset(&local_158,0,0x18);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::vector(&local_158);
  std::function<int(std::vector<int,std::allocator<int>>const&)>::
  function<(anonymous_namespace)::BuildEngineTest_duplicateRule_Test::TestBody()::__1,void>
            ((function<int(std::vector<int,std::allocator<int>>const&)> *)&local_178,&local_179);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::function
            (&local_1a0,(nullptr_t)0x0);
  std::function<void_(llbuild::core::Rule::StatusKind)>::function(&local_1c0,(nullptr_t)0x0);
  memset(&gtest_ar.message_,0,8);
  llbuild::basic::CommandSignature::CommandSignature((CommandSignature *)&gtest_ar.message_);
  update = &local_1c0;
  SimpleRule::SimpleRule
            (pSVar2,&local_140,&local_158,&local_178,&local_1a0,update,
             (CommandSignature *)&gtest_ar.message_);
  std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
  unique_ptr<std::default_delete<llbuild::core::Rule>,void>
            ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)&local_120,
             (pointer)pSVar2);
  llbuild::core::BuildEngine::addRule(&local_68,&local_120);
  std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::~unique_ptr
            (&local_120);
  std::function<void_(llbuild::core::Rule::StatusKind)>::~function(&local_1c0);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::
  ~function(&local_1a0);
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::~function(&local_178);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector(&local_158);
  llbuild::core::KeyType::~KeyType(&local_140);
  local_1dc = 1;
  local_1e8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&delegate.resolveCycle);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_1d8,"1U","delegate.errors.size()",&local_1dc,&local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,0xe2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&delegate.resolveCycle,0);
  lVar5 = std::__cxx11::string::find((char *)pvVar4,0x2db80b);
  local_209 = lVar5 != -1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_208,&local_209,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_240,(internal *)local_208,
               (AssertionResult *)"delegate.errors[0].find(\"duplicate\") != std::string::npos",
               "false","true",(char *)update);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,0xe3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  llbuild::core::BuildEngine::~BuildEngine(&local_68);
  SimpleBuildEngineDelegate::~SimpleBuildEngineDelegate((SimpleBuildEngineDelegate *)&engine);
  return;
}

Assistant:

TEST(BuildEngineTest, duplicateRule) {
  SimpleBuildEngineDelegate delegate;
  delegate.expectedError = true;

  core::BuildEngine engine(delegate);
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
    "value-A", {}, [&] (const std::vector<int>& inputs) { return 1; })));
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
    "value-A", {}, [&] (const std::vector<int>& inputs) { return 2; })));

  EXPECT_EQ(1U, delegate.errors.size());
  EXPECT_TRUE(delegate.errors[0].find("duplicate") != std::string::npos);
}